

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HModel.cpp
# Opt level: O2

void __thiscall
HModel::util_addRows
          (HModel *this,int nrows,double *XrowLower,double *XrowUpper,int nnonz,int *XARstart,
          int *XARindex,double *XARvalue)

{
  ulong uVar1;
  pointer pdVar2;
  pointer pdVar3;
  pointer pdVar4;
  pointer piVar5;
  pointer piVar6;
  undefined4 in_register_00000034;
  size_type sVar7;
  int iVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  ulong uVar12;
  long lVar13;
  int AstartColp1;
  vector<int,_std::allocator<int>_> Alength;
  value_type local_34;
  
  uVar12 = 0;
  printf("Called model.util_addRows(nrows=%d, nnonz = %d)\n",CONCAT44(in_register_00000034,nrows),
         (ulong)(uint)nnonz);
  std::ostream::flush();
  puts("H2DEBUG is being set OK");
  printf("Called model.util_addRows(nrows=%d, nnonz = %d)\n",(ulong)(uint)nrows,(ulong)(uint)nnonz);
  std::ostream::flush();
  if (nrows != 0) {
    sVar7 = (long)nrows + (long)this->numRow;
    std::vector<double,_std::allocator<double>_>::resize(&this->rowLower,sVar7);
    std::vector<double,_std::allocator<double>_>::resize(&this->rowUpper,sVar7);
    std::vector<double,_std::allocator<double>_>::resize(&this->rowScale,sVar7);
    iVar8 = this->numRow;
    uVar9 = 0;
    if (0 < nrows) {
      uVar9 = (ulong)(uint)nrows;
    }
    pdVar2 = (this->rowLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar3 = (this->rowUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar4 = (this->rowScale).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    for (; uVar9 != uVar12; uVar12 = uVar12 + 1) {
      pdVar2[(long)iVar8 + uVar12] = XrowLower[uVar12];
      pdVar3[(long)iVar8 + uVar12] = XrowUpper[uVar12];
      pdVar4[(long)iVar8 + uVar12] = 1.0;
    }
    if (0 < nnonz) {
      iVar8 = (this->Astart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[this->numCol];
      Alength.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
           = (pointer)0x0;
      Alength.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      Alength.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      local_34 = 0;
      std::vector<int,_std::allocator<int>_>::_M_fill_assign(&Alength,(long)this->numCol,&local_34);
      for (uVar12 = 0; (uint)nnonz != uVar12; uVar12 = uVar12 + 1) {
        Alength.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[XARindex[uVar12]] =
             Alength.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start[XARindex[uVar12]] + 1;
      }
      sVar7 = (long)iVar8 + (long)nnonz;
      std::vector<int,_std::allocator<int>_>::resize(&this->Aindex,sVar7);
      std::vector<double,_std::allocator<double>_>::resize(&this->Avalue,sVar7);
      piVar5 = (this->Astart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar12 = (ulong)(uint)this->numCol;
      while (0 < (int)uVar12) {
        uVar1 = uVar12 - 1;
        iVar8 = (int)sVar7 -
                Alength.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[uVar1];
        lVar10 = (long)piVar5[uVar12];
        piVar6 = (this->Aindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar2 = (this->Avalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        for (lVar11 = 0; (long)piVar5[uVar1] < lVar10 + lVar11; lVar11 = lVar11 + -1) {
          piVar6[(long)iVar8 + lVar11 + -1] = piVar6[lVar10 + lVar11 + -1];
          pdVar2[(long)iVar8 + lVar11 + -1] = pdVar2[lVar10 + lVar11 + -1];
        }
        piVar5[uVar12] = (int)sVar7;
        sVar7 = (size_type)(uint)(iVar8 + (int)lVar11);
        uVar12 = uVar1;
      }
      for (uVar12 = 0; uVar12 != uVar9; uVar12 = uVar12 + 1) {
        iVar8 = nnonz;
        if ((long)uVar12 < (long)(nrows + -1)) {
          iVar8 = XARstart[uVar12 + 1];
        }
        piVar5 = (this->Astart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        piVar6 = (this->Aindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar2 = (this->Avalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        for (lVar10 = (long)XARstart[uVar12]; lVar10 < iVar8; lVar10 = lVar10 + 1) {
          lVar11 = (long)XARindex[lVar10];
          lVar13 = (long)piVar5[lVar11 + 1] -
                   (long)Alength.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[lVar11];
          Alength.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[lVar11] =
               Alength.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
               ._M_start[lVar11] + -1;
          piVar6[lVar13] = this->numRow + (int)uVar12;
          pdVar2[lVar13] = XARvalue[lVar10];
        }
      }
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&Alength.super__Vector_base<int,_std::allocator<int>_>);
      iVar8 = this->numRow;
    }
    this->numRow = iVar8 + nrows;
    this->numTot = this->numTot + nrows;
    extendWithLogicalBasis(this,this->numCol,-1,iVar8,iVar8 + nrows + -1);
  }
  return;
}

Assistant:

void HModel::util_addRows(int nrows, const double* XrowLower, const double* XrowUpper,
			  int nnonz, const int* XARstart, const int* XARindex, const double* XARvalue) {
  assert(nrows >= 0);
  assert(nnonz >= 0);
  assert(nnonz == 0 || numCol > 0);
#ifdef JAJH_dev
  printf("Called model.util_addRows(nrows=%d, nnonz = %d)\n", nrows, nnonz);cout << flush;
#endif

#ifdef H2DEBUG
  printf("H2DEBUG is being set OK\n");
  printf("Called model.util_addRows(nrows=%d, nnonz = %d)\n", nrows, nnonz);cout << flush;
#endif


  if (nrows==0) return;

  int nwNumRow = numRow + nrows;
  rowLower.resize(nwNumRow);
  rowUpper.resize(nwNumRow);
  rowScale.resize(nwNumRow);

  for (int row = 0; row < nrows; row++) {
    rowLower[numRow+row] = XrowLower[row];
    rowUpper[numRow+row] = XrowUpper[row];
    rowScale[numRow+row] = 1.0;
  }
  //NB SCIP doesn't have XARstart[nrows] defined, so have to use nnonz for last entry
  if (nnonz > 0) {
    int cuNnonz = Astart[numCol];
    vector<int> Alength;
    Alength.assign(numCol, 0);
    for (int el = 0; el < nnonz; el++) {
      int col = XARindex[el];
      //      printf("El %2d: adding entry in column %2d\n", el, col); cout << flush;
#ifdef H2DEBUG
      assert(col >= 0);
      assert(col < numCol);
#endif
      Alength[col]++;
    }
    //Determine the new number of nonzeros and resize the column-wise matrix arrays
    int nwNnonz = cuNnonz + nnonz;
    Aindex.resize(nwNnonz);
    Avalue.resize(nwNnonz);

    //Add the new rows
    //Shift the existing columns to make space for the new entries
    int nwEl = nwNnonz;
    for (int col = numCol-1; col >= 0; col--) {
      //printf("Column %2d has additional length %2d\n", col, Alength[col]);cout << flush;
      int AstartColp1 = nwEl;
      nwEl -= Alength[col];
      //printf("Shift: nwEl = %2d\n", nwEl); cout << flush;
      for (int el = Astart[col+1]-1; el >= Astart[col]; el--) {
	nwEl--;
	//printf("Shift: Over-writing Aindex[%2d] with Aindex[%2d]=%2d\n", nwEl, el, Aindex[el]); cout << flush;
	Aindex[nwEl] = Aindex[el];
	Avalue[nwEl] = Avalue[el];
      }
      Astart[col+1] = AstartColp1;
    }
    //printf("After shift: nwEl = %2d\n", nwEl); cout << flush;
    assert(nwEl == 0);
    //util_reportColMtx(numCol, Astart, Aindex, Avalue);

    //Insert the new entries
    for (int row = 0; row < nrows; row++) {
      int fEl = XARstart[row];
      int lEl = (row < nrows-1 ? XARstart[row+1] : nnonz) - 1;
      for (int el = fEl; el <= lEl; el++) {
	int col = XARindex[el];
	nwEl = Astart[col+1]-Alength[col];
	Alength[col]--;
	//printf("Insert: row = %2d; col = %2d; Astart[col+1]-Alength[col] = %2d; Alength[col] = %2d; nwEl = %2d\n", row, col, Astart[col+1]-Alength[col], Alength[col], nwEl); cout << flush;
	assert(nwEl >= 0);
	assert(el >= 0);
	//printf("Insert: Over-writing Aindex[%2d] with Aindex[%2d]=%2d\n", nwEl, el, Aindex[el]); cout << flush;
	Aindex[nwEl] = numRow + row;
	Avalue[nwEl] = XARvalue[el];
      }
    }
  }
  //Increase the number of rows and total number of variables in the model
  numRow += nrows;
  numTot += nrows;

  //Update the basis and work vectors correponding to new basic rows
  extendWithLogicalBasis(numCol, -1, numRow-nrows, numRow-1);

}